

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  bool bVar1;
  FuncType *pFVar2;
  const_reference ppTVar3;
  FuncType *func_type;
  size_t i;
  FuncSignature *sig_local;
  Module *this_local;
  
  func_type = (FuncType *)0x0;
  while( true ) {
    pFVar2 = (FuncType *)
             std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::size(&this->types);
    if (pFVar2 <= func_type) {
      return 0xffffffff;
    }
    ppTVar3 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::operator[]
                        (&this->types,(size_type)func_type);
    pFVar2 = dyn_cast<wabt::FuncType,wabt::TypeEntry>(*ppTVar3);
    if ((pFVar2 != (FuncType *)0x0) && (bVar1 = FuncSignature::operator==(&pFVar2->sig,sig), bVar1))
    break;
    func_type = (FuncType *)((long)&(func_type->super_TypeEntry)._vptr_TypeEntry + 1);
  }
  return (Index)func_type;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < types.size(); ++i) {
    if (auto* func_type = dyn_cast<FuncType>(types[i])) {
      if (func_type->sig == sig) {
        return i;
      }
    }
  }
  return kInvalidIndex;
}